

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::LoadStoreExpr<(wabt::ExprType)3>,_std::default_delete<wabt::LoadStoreExpr<(wabt::ExprType)3>_>_>
 __thiscall
wabt::MakeUnique<wabt::LoadStoreExpr<(wabt::ExprType)3>,wabt::Opcode&,int,unsigned_int&>
          (wabt *this,Opcode *args,int *args_1,uint *args_2)

{
  Address align;
  uint32_t offset;
  LoadStoreExpr<(wabt::ExprType)3> *this_00;
  Location local_50;
  Opcode local_2c;
  uint32_t *local_28;
  uint *args_local_2;
  int *args_local_1;
  Opcode *args_local;
  
  local_28 = args_2;
  args_local_2 = (uint *)args_1;
  args_local_1 = (int *)args;
  args_local = (Opcode *)this;
  this_00 = (LoadStoreExpr<(wabt::ExprType)3> *)operator_new(0x48);
  local_2c.enum_ = *args_local_1;
  align = *args_local_2;
  offset = *local_28;
  Location::Location(&local_50);
  LoadStoreExpr<(wabt::ExprType)3>::LoadStoreExpr(this_00,local_2c,align,offset,&local_50);
  std::
  unique_ptr<wabt::LoadStoreExpr<(wabt::ExprType)3>,std::default_delete<wabt::LoadStoreExpr<(wabt::ExprType)3>>>
  ::unique_ptr<std::default_delete<wabt::LoadStoreExpr<(wabt::ExprType)3>>,void>
            ((unique_ptr<wabt::LoadStoreExpr<(wabt::ExprType)3>,std::default_delete<wabt::LoadStoreExpr<(wabt::ExprType)3>>>
              *)this,this_00);
  return (__uniq_ptr_data<wabt::LoadStoreExpr<(wabt::ExprType)3>,_std::default_delete<wabt::LoadStoreExpr<(wabt::ExprType)3>_>,_true,_true>
          )(__uniq_ptr_data<wabt::LoadStoreExpr<(wabt::ExprType)3>,_std::default_delete<wabt::LoadStoreExpr<(wabt::ExprType)3>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}